

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int Cudd_BddToCubeArray(DdManager *dd,DdNode *cube,int *array)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  DdNode **ppDVar5;
  DdNode *pDVar6;
  DdNode *e;
  DdNode *t;
  
  uVar2 = Cudd_ReadSize(dd);
  pDVar6 = (DdNode *)((ulong)dd->one ^ 1);
  for (uVar4 = (ulong)uVar2; 0 < (int)uVar4; uVar4 = uVar4 - 1) {
    array[uVar4 - 1] = 2;
  }
  do {
    iVar1 = *(int *)((ulong)cube & 0xfffffffffffffffe);
    if ((long)iVar1 == 0x7fffffff) {
      return (uint)(cube != pDVar6);
    }
    cuddGetBranches(cube,&t,&e);
    if (t == pDVar6) {
      iVar3 = 0;
      ppDVar5 = &e;
    }
    else {
      iVar3 = 1;
      ppDVar5 = &t;
      if (e != pDVar6) {
        return 0;
      }
    }
    array[iVar1] = iVar3;
    cube = *ppDVar5;
  } while( true );
}

Assistant:

int
Cudd_BddToCubeArray(
  DdManager *dd,
  DdNode *cube,
  int *array)
{
    DdNode *scan, *t, *e;
    int i;
    int size = Cudd_ReadSize(dd);
    DdNode *zero = Cudd_Not(DD_ONE(dd));

    for (i = size-1; i >= 0; i--) {
        array[i] = 2;
    }
    scan = cube;
    while (!Cudd_IsConstant(scan)) {
        int index = Cudd_Regular(scan)->index;
        cuddGetBranches(scan,&t,&e);
        if (t == zero) {
            array[index] = 0;
            scan = e;
        } else if (e == zero) {
            array[index] = 1;
            scan = t;
        } else {
            return(0);  /* cube is not a cube */
        }
    }
    if (scan == zero) {
        return(0);
    } else {
        return(1);
    }

}